

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O1

Error * ot::commissioner::TokenManager::PrepareSigningContent
                  (Error *__return_storage_ptr__,ByteArray *aContent,Message *aMessage)

{
  string *this;
  _Rb_tree_header *p_Var1;
  Type aTlvType;
  ErrorCode EVar2;
  pointer __dest;
  undefined4 uVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  _Base_ptr p_Var8;
  char *pcVar9;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  pointer __src;
  bool bVar10;
  format_args args;
  ByteArray content;
  string signingUri;
  writer write;
  TlvSet tlvSet;
  Message message;
  ByteArray local_1b8;
  int local_1a0;
  int local_19c;
  undefined1 local_198 [8];
  _Alloc_hider local_190;
  size_t local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  parse_func local_170 [1];
  string local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  ByteArray *local_140;
  string local_138;
  writer local_118;
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  local_110;
  ErrorCode local_e0;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  Message local_b8;
  
  __return_storage_ptr__->mCode = kNone;
  this = &__return_storage_ptr__->mMessage;
  local_148 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_148;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_140 = aContent;
  coap::Message::Message
            (&local_b8,*(byte *)&aMessage->mHeader >> 2 & kReset,(aMessage->mHeader).mCode);
  p_Var1 = &local_110._M_impl.super__Rb_tree_header;
  local_110._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_110._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  local_168._M_string_length = 0;
  local_168.field_2._M_local_buf[0] = '\0';
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_110._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  coap::Message::GetOption((Error *)local_198,aMessage,&local_168,kUriPath);
  uVar3 = local_198._0_4_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != &local_180) {
    operator_delete(local_190._M_p);
  }
  if (uVar3 == none_type) {
    iVar5 = std::__cxx11::string::compare((char *)&local_168);
    local_19c = std::__cxx11::string::compare((char *)&local_168);
    iVar6 = std::__cxx11::string::compare((char *)&local_168);
    if (iVar6 == 0) {
      pcVar9 = "/c/lp";
LAB_001cc757:
      std::__cxx11::string::_M_replace
                ((ulong)&local_168,0,(char *)local_168._M_string_length,(ulong)pcVar9);
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)&local_168);
      if (iVar6 == 0) {
        pcVar9 = "/c/la";
        goto LAB_001cc757;
      }
    }
    local_1a0 = iVar5;
    coap::Message::SetUriPath((Error *)local_198,&local_b8,&local_168);
    __return_storage_ptr__->mCode = local_198._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_190);
    EVar2 = __return_storage_ptr__->mCode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != &local_180) {
      operator_delete(local_190._M_p);
    }
    if (EVar2 != kNone) goto LAB_001cc894;
    coap::Message::Serialize((Error *)local_198,&local_b8,&local_1b8);
    __return_storage_ptr__->mCode = local_198._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_190);
    EVar2 = __return_storage_ptr__->mCode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != &local_180) {
      operator_delete(local_190._M_p);
    }
    __dest = local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (EVar2 != kNone) goto LAB_001cc894;
    sVar7 = coap::Message::GetHeaderLength(&local_b8);
    if (sVar7 != 0) {
      __src = __dest + sVar7;
      if ((long)local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)__src != 0) {
        memmove(__dest,__src,
                (long)local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)__src);
      }
      if (local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          __dest + ((long)local_1b8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)__src)) {
        local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             __dest + ((long)local_1b8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)__src);
      }
    }
    tlv::GetTlvSet((Error *)local_198,(TlvSet *)&local_110,&aMessage->mPayload,kMeshCoP);
    __return_storage_ptr__->mCode = local_198._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_190);
    EVar2 = __return_storage_ptr__->mCode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_p != &local_180) {
      operator_delete(local_190._M_p);
    }
    iVar6 = local_19c;
    iVar5 = local_1a0;
    if (EVar2 != kNone) goto LAB_001cc894;
    if ((_Rb_tree_header *)local_110._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      p_Var8 = local_110._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        aTlvType = (Type)p_Var8[1]._M_color;
        if (iVar6 == 0) {
          if (aTlvType != kDelayTimer) goto LAB_001cc94a;
        }
        else {
          if (iVar5 == 0) {
LAB_001cc94a:
            bVar10 = tlv::IsDatasetParameter(iVar6 != 0,aTlvType);
          }
          else {
            bVar10 = aTlvType != kCommissionerPenSignature &&
                     (byte)(aTlvType + (kDiscoveryRequest|kCommissionerToken)) < 0xfe;
          }
          if (bVar10 != false) {
            tlv::Tlv::Serialize((Tlv *)p_Var8[1]._M_parent,&local_1b8);
          }
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != p_Var1);
    }
    local_138._M_dataplus._M_p =
         (pointer)(local_140->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    (local_140->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start =
         local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    (local_140->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish =
         local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (local_140->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((pointer)local_138._M_dataplus._M_p == (pointer)0x0) goto LAB_001cc894;
  }
  else {
    local_198._0_4_ = none_type;
    pcVar9 = "the CoAP message has no valid URI Path option";
    local_190._M_p = "the CoAP message has no valid URI Path option";
    local_188 = 0x2d;
    local_180._M_allocated_capacity = 0;
    local_170[0] = (parse_func)0x0;
    local_180._8_8_ = (format_string_checker<char> *)local_198;
    local_118.handler_ = (format_string_checker<char> *)local_198;
    do {
      if (pcVar9 == "") break;
      to = pcVar9;
      if (*pcVar9 == '{') {
LAB_001cc620:
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_118,pcVar9,to);
        pcVar9 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (to,"",(format_string_checker<char> *)local_198);
        bVar10 = true;
      }
      else {
        to = pcVar9 + 1;
        bVar10 = to != "";
        if (bVar10) {
          if (*to != '{') {
            pcVar4 = pcVar9 + 2;
            do {
              to = pcVar4;
              bVar10 = to != "";
              if (to == "") goto LAB_001cc61c;
              pcVar4 = to + 1;
            } while (*to != '{');
          }
          bVar10 = true;
        }
LAB_001cc61c:
        if (bVar10) goto LAB_001cc620;
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_118,pcVar9,"");
        bVar10 = false;
      }
    } while (bVar10);
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_198;
    fmt::v10::vformat_abi_cxx11_
              (&local_138,(v10 *)"the CoAP message has no valid URI Path option",
               (string_view)ZEXT816(0x2d),args);
    local_e0 = kInvalidArgs;
    local_d8[0] = local_c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d8,local_138._M_dataplus._M_p,
               local_138._M_dataplus._M_p + local_138._M_string_length);
    __return_storage_ptr__->mCode = local_e0;
    std::__cxx11::string::operator=((string *)this,(string *)local_d8);
    if (local_d8[0] != local_c8) {
      operator_delete(local_d8[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_001cc894;
  }
  operator_delete(local_138._M_dataplus._M_p);
LAB_001cc894:
  if (local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  std::
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~_Rb_tree(&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.mRequestUri._M_dataplus._M_p != &local_b8.mRequestUri.field_2) {
    operator_delete(local_b8.mRequestUri._M_dataplus._M_p);
  }
  if (local_b8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.mPayload.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  ::~_Rb_tree(&local_b8.mOptions._M_t);
  return __return_storage_ptr__;
}

Assistant:

Error TokenManager::PrepareSigningContent(ByteArray &aContent, const coap::Message &aMessage)
{
    Error         error;
    coap::Message message{aMessage.GetType(), aMessage.GetCode()};
    tlv::TlvSet   tlvSet;
    std::string   signingUri;
    bool          isActiveSet  = false;
    bool          isPendingSet = false;
    ByteArray     content;

    VerifyOrExit(aMessage.GetUriPath(signingUri) == ErrorCode::kNone,
                 error = ERROR_INVALID_ARGS("the CoAP message has no valid URI Path option"));

    isActiveSet  = signingUri == uri::kMgmtActiveSet;
    isPendingSet = signingUri == uri::kMgmtPendingSet;

    if (signingUri == uri::kPetitioning)
    {
        signingUri = uri::kLeaderPetitioning;
    }
    else if (signingUri == uri::kKeepAlive)
    {
        signingUri = uri::kLeaderKeepAlive;
    }

    // Prepare serialized URI
    SuccessOrExit(error = message.SetUriPath(signingUri));
    SuccessOrExit(error = message.Serialize(content));
    content.erase(content.begin(), content.begin() + message.GetHeaderLength());

    // Sort and serialize TLVs
    SuccessOrExit(error = tlv::GetTlvSet(tlvSet, aMessage.GetPayload()));
    for (const auto &tlv : tlvSet)
    {
        if (ShouldBeSerialized(tlv.first, isActiveSet, isPendingSet))
        {
            tlv.second->Serialize(content);
        }
    }

    aContent = std::move(content);

exit:
    return error;
}